

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

void pbrt::PtexTextureBase::ReportStats(void)

{
  long *plVar1;
  long *in_FS_OFFSET;
  Stats stats;
  long local_40;
  undefined1 local_38 [8];
  long local_30;
  long local_18;
  long local_8;
  
  if (cache != (long *)0x0) {
    (**(code **)(*cache + 0x48))(cache,local_38);
    *(long *)(*in_FS_OFFSET + -0x40) = local_18 + *(long *)(*in_FS_OFFSET + -0x40);
    *(long *)(*in_FS_OFFSET + -0x38) = local_8 + *(long *)(*in_FS_OFFSET + -0x38);
    local_40 = local_30;
    plVar1 = std::max<long>((long *)(*in_FS_OFFSET + -0x30),&local_40);
    *(long *)(*in_FS_OFFSET + -0x30) = *plVar1;
  }
  return;
}

Assistant:

void PtexTextureBase::ReportStats() {
    if (!cache)
        return;

    Ptex::PtexCache::Stats stats;
    cache->getStats(stats);

    nFilesAccessed += stats.filesAccessed;
    nBlockReads += stats.blockReads;
    peakMemoryUsed = std::max(peakMemoryUsed, int64_t(stats.peakMemUsed));
}